

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::printInfo(FastText *this,real progress,real loss,ostream *log_stream)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  int32_t duration;
  double dVar4;
  float fVar5;
  ClockPrint local_2c;
  time_point local_28;
  
  local_28.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  dVar4 = utils::getDuration(&this->start_,&local_28);
  dVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lr;
  duration = 0x278d00;
  fVar5 = progress;
  if ((0.0 < progress) && (0.0 <= dVar4)) {
    fVar5 = progress * 100.0;
    duration = (int32_t)(long)((dVar4 * (double)(100.0 - fVar5)) / (double)fVar5);
  }
  *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) =
       *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(log_stream,"Progress: ");
  lVar2 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar2 + -0x18) + 8) = 1;
  *(undefined8 *)(log_stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  poVar3 = (ostream *)std::ostream::operator<<(log_stream,fVar5);
  std::operator<<(poVar3,"%");
  poVar3 = std::operator<<(log_stream," words/sec/thread: ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 7;
  std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(log_stream," lr: ");
  lVar2 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 9;
  *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 8) = 6;
  std::ostream::_M_insert<double>((1.0 - (double)progress) * dVar1);
  poVar3 = std::operator<<(log_stream," avg.loss: ");
  lVar2 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 9;
  *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 8) = 6;
  std::ostream::operator<<(poVar3,loss);
  poVar3 = std::operator<<(log_stream," ETA: ");
  utils::ClockPrint::ClockPrint(&local_2c,duration);
  utils::operator<<(poVar3,&local_2c);
  std::ostream::flush();
  return;
}

Assistant:

void FastText::printInfo(real progress, real loss, std::ostream& log_stream) {
  double t = utils::getDuration(start_, std::chrono::steady_clock::now());
  double lr = args_->lr * (1.0 - progress);
  double wst = 0;

  int64_t eta = 2592000; // Default to one month in seconds (720 * 3600)

  if (progress > 0 && t >= 0) {
    progress = progress * 100;
    eta = t * (100 - progress) / progress;
    wst = double(tokenCount_) / t / args_->thread;
  }

  log_stream << std::fixed;
  log_stream << "Progress: ";
  log_stream << std::setprecision(1) << std::setw(5) << progress << "%";
  log_stream << " words/sec/thread: " << std::setw(7) << int64_t(wst);
  log_stream << " lr: " << std::setw(9) << std::setprecision(6) << lr;
  log_stream << " avg.loss: " << std::setw(9) << std::setprecision(6) << loss;
  log_stream << " ETA: " << utils::ClockPrint(eta);
  log_stream << std::flush;
}